

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateCursorImage(_GLFWwindow *window)

{
  Window WVar1;
  
  if ((window->cursorMode != 0x34004) && (window->cursorMode != 0x34001)) {
    (*_glfw.x11.xlib.DefineCursor)
              (_glfw.x11.display,(window->x11).handle,_glfw.x11.hiddenCursorHandle);
    return;
  }
  WVar1 = (window->x11).handle;
  if (window->cursor != (_GLFWcursor *)0x0) {
    (*_glfw.x11.xlib.DefineCursor)(_glfw.x11.display,WVar1,(window->cursor->x11).handle);
    return;
  }
  (*_glfw.x11.xlib.UndefineCursor)(_glfw.x11.display,WVar1);
  return;
}

Assistant:

static void updateCursorImage(_GLFWwindow* window)
{
    if (window->cursorMode == GLFW_CURSOR_NORMAL ||
        window->cursorMode == GLFW_CURSOR_CAPTURED)
    {
        if (window->cursor)
        {
            XDefineCursor(_glfw.x11.display, window->x11.handle,
                          window->cursor->x11.handle);
        }
        else
            XUndefineCursor(_glfw.x11.display, window->x11.handle);
    }
    else
    {
        XDefineCursor(_glfw.x11.display, window->x11.handle,
                      _glfw.x11.hiddenCursorHandle);
    }
}